

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::initial(Model *this,bool set_val)

{
  int iVar1;
  real_t *prVar2;
  ostream *poVar3;
  allocator local_66;
  allocator local_65;
  Logger local_64;
  string local_60;
  string local_40;
  
  prVar2 = (real_t *)malloc((ulong)this->param_num_w_ << 2);
  this->param_w_ = prVar2;
  prVar2 = (real_t *)malloc((ulong)this->aux_size_ << 2);
  this->param_b_ = prVar2;
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 != 0) {
      this->param_v_ = (real_t *)0x0;
      goto LAB_00146915;
    }
  }
  iVar1 = posix_memalign(&this->param_v_,0x10,(ulong)this->param_num_v_ << 2);
  if (iVar1 != 0) {
    local_64.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
               ,&local_65);
    std::__cxx11::string::string((string *)&local_60,"initial",&local_66);
    poVar3 = Logger::Start(ERR,&local_40,99,&local_60);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,99);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"ret");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    Logger::~Logger(&local_64);
    abort();
  }
LAB_00146915:
  if (set_val) {
    set_value(this);
  }
  return;
}

Assistant:

void Model::initial(bool set_val) {
  try {
    // Conventional malloc for linear term and bias
    param_w_ = (real_t*)malloc(param_num_w_ * sizeof(real_t));
    param_b_ = (real_t*)malloc(aux_size_ * sizeof(real_t));
    if (score_func_.compare("fm") == 0 ||
        score_func_.compare("ffm") == 0) {
      // Aligned malloc for latent factor
#ifdef _MSC_VER
      param_v_ = (decltype(param_v_))_aligned_malloc(
                 param_num_v_ * sizeof(real_t),
                 kAlignByte);
#else
      int ret = posix_memalign(
                (void**)&param_v_,
                kAlignByte,
                param_num_v_ * sizeof(real_t));
      CHECK_EQ(ret, 0);
#endif
    } else {
      param_v_ = nullptr;
    }
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for current  \
                   model parameters. Parameter size: "
               << GetNumParameter();
  }
  // Set value for model
  if (set_val) {
    set_value();
  }
}